

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8 * google::protobuf::io::(anonymous_namespace)::DecodeVarint64KnownSize<10ul>
                  (uint8 *buffer,uint64 *value)

{
  int offset;
  long lVar1;
  uint64 uVar2;
  byte *pbVar3;
  
  uVar2 = (ulong)buffer[9] << 0x3f;
  pbVar3 = buffer;
  for (lVar1 = 0; lVar1 != 0x3f; lVar1 = lVar1 + 7) {
    uVar2 = uVar2 + ((ulong)*pbVar3 - 0x80 << ((byte)lVar1 & 0x3f));
    pbVar3 = pbVar3 + 1;
  }
  *value = uVar2;
  return buffer + 10;
}

Assistant:

const uint8* DecodeVarint64KnownSize(const uint8* buffer, uint64* value) {
  GOOGLE_DCHECK_GT(N, 0);
  uint64 result = static_cast<uint64>(buffer[N - 1]) << (7 * (N - 1));
  for (int i = 0, offset = 0; i < N - 1; i++, offset += 7) {
    result += static_cast<uint64>(buffer[i] - 0x80) << offset;
  }
  *value = result;
  return buffer + N;
}